

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

void bcf_header_debug(bcf_hdr_t *hdr)

{
  char *pcVar1;
  bcf_hrec_t *pbVar2;
  long lVar3;
  long lVar4;
  
  for (lVar4 = 0; lVar4 < hdr->nhrec; lVar4 = lVar4 + 1) {
    pcVar1 = hdr->hrec[lVar4]->key;
    if (hdr->hrec[lVar4]->value == (char *)0x0) {
      fprintf(_stderr,"##%s=<",pcVar1);
      fprintf(_stderr,"%s=%s",*hdr->hrec[lVar4]->keys,*hdr->hrec[lVar4]->vals);
      lVar3 = 1;
      while( true ) {
        pbVar2 = hdr->hrec[lVar4];
        if (pbVar2->nkeys <= lVar3) break;
        fprintf(_stderr,",%s=%s",pbVar2->keys[lVar3],pbVar2->vals[lVar3]);
        lVar3 = lVar3 + 1;
      }
      fwrite(">\n",2,1,_stderr);
    }
    else {
      fprintf(_stderr,"##%s=%s\n",pcVar1);
    }
  }
  return;
}

Assistant:

void bcf_header_debug(bcf_hdr_t *hdr)
{
    int i, j;
    for (i=0; i<hdr->nhrec; i++)
    {
        if ( !hdr->hrec[i]->value )
        {
            fprintf(stderr, "##%s=<", hdr->hrec[i]->key);
            fprintf(stderr,"%s=%s", hdr->hrec[i]->keys[0], hdr->hrec[i]->vals[0]);
            for (j=1; j<hdr->hrec[i]->nkeys; j++)
                fprintf(stderr,",%s=%s", hdr->hrec[i]->keys[j], hdr->hrec[i]->vals[j]);
            fprintf(stderr,">\n");
        }
        else
            fprintf(stderr,"##%s=%s\n", hdr->hrec[i]->key,hdr->hrec[i]->value);
    }
}